

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::timerEvent(QTextEdit *this,QTimerEvent *e)

{
  int iVar1;
  int iVar2;
  SliderAction action;
  QTextEditPrivate *pQVar3;
  int *piVar4;
  long *in_RDI;
  long in_FS_OFFSET;
  int timeout;
  int delta;
  QTextEditPrivate *d;
  int deltaX;
  int deltaY;
  QMouseEvent ev;
  QPoint globalPos;
  QPoint pos;
  QRect visible;
  undefined4 in_stack_fffffffffffffe48;
  KeyboardModifier in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  QPoint *in_stack_fffffffffffffe58;
  QWidget *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  SliderAction in_stack_fffffffffffffe6c;
  QWidget *in_stack_fffffffffffffe70;
  QRect *this_00;
  int in_stack_fffffffffffffe7c;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  undefined1 local_f8 [24];
  undefined4 local_e0;
  undefined4 local_dc;
  undefined1 local_d8 [16];
  QPoint local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  QMouseEvent local_a0 [80];
  QPoint local_50;
  undefined1 *local_48;
  int local_40;
  int local_3c [3];
  int local_30;
  int local_2c [3];
  QPoint local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QTextEdit *)0x6d293e);
  iVar1 = QTimerEvent::timerId((QTimerEvent *)0x6d2953);
  iVar2 = QBasicTimer::timerId((QBasicTimer *)0x6d296b);
  if (iVar1 == iVar2) {
    local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (undefined1  [16])
               QWidget::rect((QWidget *)
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_20 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    if (((byte)pQVar3->field_0x320 >> 3 & 1) == 0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = (undefined1 *)QCursor::pos();
      local_50 = QWidget::mapFromGlobal(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_20 = local_50;
      memset(local_a0,0xaa,0x50);
      QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      QWidget::topLevelWidget((QWidget *)0x6d2bbe);
      local_c8 = QWidget::mapTo(in_stack_fffffffffffffe70,
                                (QWidget *)
                                CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                (QPoint *)in_stack_fffffffffffffe60);
      QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      QPointF::QPointF((QPointF *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (QPoint *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      QFlags<Qt::MouseButton>::QFlags
                ((QFlags<Qt::MouseButton> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c);
      QFlags<Qt::KeyboardModifier>::QFlags
                ((QFlags<Qt::KeyboardModifier> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c);
      QString::QString((QString *)0x6d2c33);
      in_stack_fffffffffffffe58 =
           (QPoint *)QPointingDevice::primaryPointingDevice((QString *)local_f8);
      QMouseEvent::QMouseEvent
                (local_a0,MouseMove,(QPointF *)local_b0,(QPointF *)local_c0,(QPointF *)local_d8,
                 LeftButton,(QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffffe4c,local_dc),
                 (QFlags_conflict1 *)CONCAT44(in_stack_fffffffffffffe54,local_e0),
                 (QPointingDevice *)in_stack_fffffffffffffe58);
      QString::~QString((QString *)0x6d2c9b);
      (**(code **)(*in_RDI + 0xb0))(in_RDI,local_a0);
      QMouseEvent::~QMouseEvent(local_a0);
      in_stack_fffffffffffffe48 = local_dc;
    }
    else {
      local_20 = pQVar3->autoScrollDragPos;
      local_2c[2] = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48));
      local_2c[2] = local_2c[2] / 3;
      local_2c[1] = 0x14;
      qMin<int>(local_2c + 2,local_2c + 1);
      local_2c[0] = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe4c,
                                                    in_stack_fffffffffffffe48));
      local_2c[0] = local_2c[0] / 3;
      local_30 = 0x14;
      qMin<int>(local_2c,&local_30);
      local_3c[2] = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48));
      local_3c[2] = local_3c[2] / 3;
      local_3c[1] = 0x14;
      qMin<int>(local_3c + 2,local_3c + 1);
      local_3c[0] = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe4c,
                                                    in_stack_fffffffffffffe48));
      local_3c[0] = local_3c[0] / 3;
      local_40 = 0x14;
      qMin<int>(local_3c,&local_40);
      QRect::adjust((QRect *)in_stack_fffffffffffffe60,
                    (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)in_stack_fffffffffffffe58,
                    in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
    }
    iVar1 = QPoint::y((QPoint *)0x6d2ccb);
    local_100 = QRect::top((QRect *)0x6d2cdc);
    local_100 = iVar1 - local_100;
    iVar1 = QRect::bottom((QRect *)0x6d2cf8);
    local_104 = QPoint::y((QPoint *)0x6d2d09);
    local_104 = iVar1 - local_104;
    piVar4 = qMax<int>(&local_100,&local_104);
    iVar1 = *piVar4;
    local_fc = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
    ;
    local_fc = iVar1 - local_fc;
    iVar1 = QPoint::x((QPoint *)0x6d2d5c);
    local_10c = QRect::left((QRect *)0x6d2d6d);
    local_10c = iVar1 - local_10c;
    iVar1 = QRect::right((QRect *)0x6d2d89);
    local_110 = QPoint::x((QPoint *)0x6d2d9a);
    local_110 = iVar1 - local_110;
    piVar4 = qMax<int>(&local_10c,&local_110);
    iVar1 = *piVar4;
    local_108 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))
    ;
    local_108 = iVar1 - local_108;
    piVar4 = qMax<int>(&local_108,&local_fc);
    if (-1 < *piVar4) {
      QBasicTimer::start((QBasicTimer *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe7c,
                         (QObject *)in_stack_fffffffffffffe58);
      if (0 < local_fc) {
        QPoint::y((QPoint *)0x6d2e72);
        QRect::center((QRect *)in_stack_fffffffffffffe70);
        QPoint::y((QPoint *)0x6d2e98);
        QAbstractSlider::triggerAction
                  ((QAbstractSlider *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      }
      if (0 < local_108) {
        this_00 = (QRect *)(pQVar3->super_QAbstractScrollAreaPrivate).hbar;
        action = QPoint::x((QPoint *)0x6d2ee2);
        QRect::center(this_00);
        QPoint::x((QPoint *)0x6d2f08);
        QAbstractSlider::triggerAction((QAbstractSlider *)this_00,action);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::timerEvent(QTimerEvent *e)
{
    Q_D(QTextEdit);
    if (e->timerId() == d->autoScrollTimer.timerId()) {
        QRect visible = d->viewport->rect();
        QPoint pos;
        if (d->inDrag) {
            pos = d->autoScrollDragPos;
            visible.adjust(qMin(visible.width()/3,20), qMin(visible.height()/3,20),
                           -qMin(visible.width()/3,20), -qMin(visible.height()/3,20));
        } else {
            const QPoint globalPos = QCursor::pos();
            pos = d->viewport->mapFromGlobal(globalPos);
            QMouseEvent ev(QEvent::MouseMove, pos, mapTo(topLevelWidget(), pos), globalPos, Qt::LeftButton, Qt::LeftButton, Qt::NoModifier);
            mouseMoveEvent(&ev);
        }
        int deltaY = qMax(pos.y() - visible.top(), visible.bottom() - pos.y()) - visible.height();
        int deltaX = qMax(pos.x() - visible.left(), visible.right() - pos.x()) - visible.width();
        int delta = qMax(deltaX, deltaY);
        if (delta >= 0) {
            if (delta < 7)
                delta = 7;
            int timeout = 4900 / (delta * delta);
            d->autoScrollTimer.start(timeout, this);

            if (deltaY > 0)
                d->vbar->triggerAction(pos.y() < visible.center().y() ?
                                       QAbstractSlider::SliderSingleStepSub
                                       : QAbstractSlider::SliderSingleStepAdd);
            if (deltaX > 0)
                d->hbar->triggerAction(pos.x() < visible.center().x() ?
                                       QAbstractSlider::SliderSingleStepSub
                                       : QAbstractSlider::SliderSingleStepAdd);
        }
    }
#ifdef QT_KEYPAD_NAVIGATION
    else if (e->timerId() == d->deleteAllTimer.timerId()) {
        d->deleteAllTimer.stop();
        clear();
    }
#endif
}